

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

Side * __thiscall Application::querySide(Side *__return_storage_ptr__,Application *this)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 *puVar2;
  CHAR *value_00;
  undefined6 uStack_18;
  char value;
  
  _uStack_18 = in_RAX;
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"1) Buy");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"2) Sell");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"3) Sell Short");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"4) Sell Short Exempt");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"5) Cross");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"6) Cross Short");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"7) Cross Short Exempt");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"Side: ");
  std::operator>>((istream *)&std::cin,&value);
  switch(value) {
  case '1':
    value_00 = "12568912340321511Application";
    break;
  case '2':
    value_00 = "2568912340321511Application";
    break;
  case '3':
    value_00 = "568912340321511Application";
    break;
  case '4':
    value_00 = "68912340321511Application";
    break;
  case '5':
    value_00 = "8912340321511Application";
    break;
  case '6':
    value_00 = "912340321511Application";
    break;
  case '7':
    value_00 = &stack0xffffffffffffffee;
    _uStack_18 = CONCAT16(0x41,uStack_18);
    break;
  default:
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = FIX::DoubleConvertor::fast_fixed_dtoa;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
  FIX::Side::Side(__return_storage_ptr__,value_00);
  return __return_storage_ptr__;
}

Assistant:

FIX::Side Application::querySide() {
  char value;
  std::cout << std::endl
            << "1) Buy" << std::endl
            << "2) Sell" << std::endl
            << "3) Sell Short" << std::endl
            << "4) Sell Short Exempt" << std::endl
            << "5) Cross" << std::endl
            << "6) Cross Short" << std::endl
            << "7) Cross Short Exempt" << std::endl
            << "Side: ";

  std::cin >> value;
  switch (value) {
  case '1':
    return FIX::Side(FIX::Side_BUY);
  case '2':
    return FIX::Side(FIX::Side_SELL);
  case '3':
    return FIX::Side(FIX::Side_SELL_SHORT);
  case '4':
    return FIX::Side(FIX::Side_SELL_SHORT_EXEMPT);
  case '5':
    return FIX::Side(FIX::Side_CROSS);
  case '6':
    return FIX::Side(FIX::Side_CROSS_SHORT);
  case '7':
    return FIX::Side('A');
  default:
    throw std::exception();
  }
}